

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selfguided_filter_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_568eea::AV1HighbdSelfguidedFilterTest_CorrectnessTest_Test::TestBody
          (AV1HighbdSelfguidedFilterTest_CorrectnessTest_Test *this)

{
  undefined8 *puVar1;
  uint8_t *puVar2;
  uint32_t uVar3;
  ParamType *pPVar4;
  uint uVar5;
  uint16_t *puVar6;
  int iVar7;
  unsigned_short *puVar8;
  unsigned_short *puVar9;
  ulong uVar10;
  ulong uVar11;
  SEARCH_METHODS *pSVar12;
  unsigned_short *puVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  unsigned_short *puVar17;
  int iVar18;
  long lVar19;
  int xqd [2];
  int32_t *tmpbuf;
  internal local_110 [8];
  undefined8 *local_108;
  uint16_t *output2_;
  AssertHelper local_f8;
  uint16_t *output_;
  uint8_t *local_e8;
  ACMRandom rnd;
  AssertHelper local_d8;
  uint local_cc;
  int local_c8;
  int local_c4;
  unsigned_short *local_c0;
  unsigned_short *local_b8;
  ulong local_b0;
  ulong local_a8;
  uint16_t *input_;
  uint16_t *local_98;
  ulong local_90;
  ulong local_88;
  uint16_t *local_80;
  ulong local_78;
  ulong local_70;
  unsigned_short *local_68;
  unsigned_short *local_60;
  uint16_t *local_58;
  AV1HighbdSelfguidedFilterTest_CorrectnessTest_Test *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  pPVar4 = testing::
           WithParamInterface<std::tuple<int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_int>_>
           ::GetParam();
  (this->super_AV1HighbdSelfguidedFilterTest).tst_fun_ =
       (SgrFunc)(pPVar4->
                super__Tuple_impl<0UL,_int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_int>
                ).
                super__Head_base<0UL,_int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_false>
                ._M_head_impl;
  pPVar4 = testing::
           WithParamInterface<std::tuple<int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_int>_>
           ::GetParam();
  uVar5 = (pPVar4->
          super__Tuple_impl<0UL,_int_(*)(const_unsigned_char_*,_int,_int,_int,_int,_const_int_*,_unsigned_char_*,_int,_int_*,_int,_int),_int>
          ).super__Tuple_impl<1UL,_int>.super__Head_base<1UL,_int,_false>._M_head_impl;
  input_ = (uint16_t *)aom_memalign(0x20,0x5fd00);
  output_ = (uint16_t *)0x0;
  testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
            (local_110,"input_","nullptr",&input_,&output_);
  puVar1 = local_108;
  if (local_110[0] == (internal)0x0) {
    testing::Message::Message((Message *)&output_);
    if (local_108 == (undefined8 *)0x0) {
      pSVar12 = "";
    }
    else {
      pSVar12 = (SEARCH_METHODS *)*local_108;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&output2_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
               ,0x157,(char *)pSVar12);
    testing::internal::AssertHelper::operator=((AssertHelper *)&output2_,(Message *)&output_);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&output2_);
    if (output_ != (uint16_t *)0x0) {
      (**(code **)(*(long *)output_ + 8))();
    }
    if (local_108 == (undefined8 *)0x0) {
      return;
    }
    if ((undefined8 *)*local_108 != local_108 + 2) {
      operator_delete((undefined8 *)*local_108);
    }
  }
  else {
    if (local_108 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_108 != local_108 + 2) {
        operator_delete((undefined8 *)*local_108);
      }
      operator_delete(puVar1);
    }
    output_ = (uint16_t *)aom_memalign(0x20,0x5fd00);
    output2_ = (uint16_t *)0x0;
    testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
              (local_110,"output_","nullptr",&output_,&output2_);
    puVar1 = local_108;
    if (local_110[0] == (internal)0x0) {
      testing::Message::Message((Message *)&output2_);
      if (local_108 == (undefined8 *)0x0) {
        pSVar12 = "";
      }
      else {
        pSVar12 = (SEARCH_METHODS *)*local_108;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&tmpbuf,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
                 ,0x15a,(char *)pSVar12);
      testing::internal::AssertHelper::operator=((AssertHelper *)&tmpbuf,(Message *)&output2_);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&tmpbuf);
      if (output2_ != (uint16_t *)0x0) {
        (**(code **)(*(long *)output2_ + 8))();
      }
      if (local_108 == (undefined8 *)0x0) {
        return;
      }
      if ((undefined8 *)*local_108 != local_108 + 2) {
        operator_delete((undefined8 *)*local_108);
      }
    }
    else {
      if (local_108 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_108 != local_108 + 2) {
          operator_delete((undefined8 *)*local_108);
        }
        operator_delete(puVar1);
      }
      output2_ = (uint16_t *)aom_memalign(0x20,0x5fd00);
      tmpbuf = (int32_t *)0x0;
      testing::internal::CmpHelperNE<unsigned_short*,decltype(nullptr)>
                (local_110,"output2_","nullptr",&output2_,&tmpbuf);
      puVar1 = local_108;
      if (local_110[0] == (internal)0x0) {
        testing::Message::Message((Message *)&tmpbuf);
        if (local_108 == (undefined8 *)0x0) {
          pSVar12 = "";
        }
        else {
          pSVar12 = (SEARCH_METHODS *)*local_108;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)xqd,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
                   ,0x15d,(char *)pSVar12);
        testing::internal::AssertHelper::operator=((AssertHelper *)xqd,(Message *)&tmpbuf);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)xqd);
        if (tmpbuf != (int32_t *)0x0) {
          (**(code **)(*(long *)tmpbuf + 8))();
        }
        if (local_108 == (undefined8 *)0x0) {
          return;
        }
        if ((undefined8 *)*local_108 != local_108 + 2) {
          operator_delete((undefined8 *)*local_108);
        }
      }
      else {
        if (local_108 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_108 != local_108 + 2) {
            operator_delete((undefined8 *)*local_108);
          }
          operator_delete(puVar1);
        }
        tmpbuf = (int32_t *)aom_memalign(0x20,0x13b9a0);
        xqd[0] = 0;
        xqd[1] = 0;
        testing::internal::CmpHelperNE<int*,decltype(nullptr)>
                  (local_110,"tmpbuf","nullptr",&tmpbuf,(void **)xqd);
        puVar1 = local_108;
        if (local_110[0] != (internal)0x0) {
          if (local_108 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_108 != local_108 + 2) {
              operator_delete((undefined8 *)*local_108);
            }
            operator_delete(puVar1);
          }
          puVar6 = input_;
          local_b8 = output_ + 0x2a10;
          local_c0 = output2_ + 0x2a10;
          rnd.random_.state_ = (Random)0xbaba;
          local_a8 = (ulong)uVar5;
          local_50 = this;
          av1_loop_restoration_precal();
          local_cc = ~(-1 << ((byte)uVar5 & 0x1f));
          local_80 = puVar6 + 0x2a10;
          uVar11 = 0;
          iVar7 = 0x104;
          local_98 = puVar6;
          do {
            uVar5 = local_cc;
            iVar15 = (int)(uVar11 / 9);
            local_b0 = (ulong)(0x104 - iVar15);
            iVar18 = (int)(uVar11 / 9);
            local_e8 = (uint8_t *)CONCAT44(local_e8._4_4_,(int)uVar11 + iVar18 * -9);
            local_88 = (ulong)(uint)(iVar18 * 9 + iVar7);
            lVar19 = -0x10;
            puVar6 = local_98;
            local_c8 = iVar7;
            local_90 = uVar11;
            do {
              lVar14 = 0;
              do {
                uVar3 = testing::internal::Random::Generate(&rnd.random_,0x80000000);
                puVar6[lVar14] = (ushort)(uVar3 >> 0xf) & (ushort)uVar5;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0x124);
              lVar19 = lVar19 + 1;
              puVar6 = puVar6 + 0x2a0;
            } while (lVar19 != 0x114);
            uVar3 = testing::internal::Random::Generate(&rnd.random_,0x80);
            xqd[0] = uVar3 - 0x60;
            uVar3 = testing::internal::Random::Generate(&rnd.random_,0x80);
            xqd[1] = uVar3 - 0x20;
            uVar3 = testing::internal::Random::Generate(&rnd.random_,0x10);
            local_78 = (ulong)(0x104 - (int)local_e8);
            uVar11 = 0;
            puVar6 = local_80;
            puVar8 = local_b8;
            puVar13 = local_c0;
            local_48 = (ulong)(0x104 - iVar15);
            do {
              local_38 = (ulong)puVar8 >> 1;
              local_40 = (ulong)puVar6 >> 1;
              local_c4 = (int)local_78 - (int)uVar11;
              if (0x3f < local_c4) {
                local_c4 = 0x40;
              }
              uVar16 = local_b0 & 0xffffffff;
              uVar10 = 0;
              local_70 = uVar11;
              local_68 = puVar13;
              local_60 = puVar8;
              local_58 = puVar6;
              do {
                iVar7 = local_c4;
                iVar15 = (int)uVar16;
                iVar18 = 0x40;
                if (iVar15 < 0x40) {
                  iVar18 = iVar15;
                }
                local_e8 = (uint8_t *)(local_40 + uVar10);
                (*(local_50->super_AV1HighbdSelfguidedFilterTest).tst_fun_)
                          (local_e8,iVar18,local_c4,0x2a0,uVar3,xqd,(uint8_t *)(local_38 + uVar10),
                           0x2a0,tmpbuf,(int)local_a8,1);
                uVar11 = local_48;
                av1_apply_selfguided_restoration_c
                          (local_e8,iVar18,iVar7,0x2a0,uVar3,xqd,(uint8_t *)((ulong)puVar13 >> 1),
                           0x2a0,tmpbuf,(int)local_a8,1);
                uVar10 = uVar10 + 0x40;
                puVar13 = puVar13 + 0x40;
                uVar16 = (ulong)(iVar15 - 0x40);
              } while (uVar10 < uVar11);
              uVar11 = local_70 + 0x40;
              puVar13 = local_68 + 0xa800;
              puVar8 = local_60 + 0xa800;
              puVar6 = local_58 + 0xa800;
            } while (uVar11 < local_78);
            puVar8 = local_c0;
            uVar11 = local_b0;
            puVar13 = local_b8;
            puVar2 = (uint8_t *)0;
            puVar17 = local_c0;
            puVar9 = local_b8;
            do {
              do {
                local_e8 = puVar2;
                testing::internal::CmpHelperEQ<unsigned_short,unsigned_short>
                          (local_110,"output[j * out_stride + k]","output2[j * out_stride + k]",
                           puVar13,puVar8);
                puVar1 = local_108;
                if (local_110[0] == (internal)0x0) {
                  testing::Message::Message((Message *)&local_f8);
                  if (local_108 == (undefined8 *)0x0) {
                    pSVar12 = "";
                  }
                  else {
                    pSVar12 = (SEARCH_METHODS *)*local_108;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_d8,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
                             ,0x189,(char *)pSVar12);
                  testing::internal::AssertHelper::operator=(&local_d8,(Message *)&local_f8);
                  testing::internal::AssertHelper::~AssertHelper(&local_d8);
                  if (local_f8.data_ != (AssertHelperData *)0x0) {
                    (**(code **)(*(long *)local_f8.data_ + 8))();
                  }
                  if (local_108 == (undefined8 *)0x0) {
                    return;
                  }
                  if ((undefined8 *)*local_108 != local_108 + 2) {
                    operator_delete((undefined8 *)*local_108);
                  }
                  goto LAB_00489190;
                }
                if (local_108 != (undefined8 *)0x0) {
                  if ((undefined8 *)*local_108 != local_108 + 2) {
                    operator_delete((undefined8 *)*local_108);
                  }
                  operator_delete(puVar1);
                }
                uVar11 = uVar11 - 1;
                puVar8 = puVar8 + 1;
                puVar13 = puVar13 + 1;
                puVar2 = local_e8;
              } while (uVar11 != 0);
              puVar8 = puVar17 + 0x2a0;
              puVar13 = puVar9 + 0x2a0;
              uVar11 = local_b0;
              puVar2 = (uint8_t *)((long)local_e8 + 1U);
              puVar17 = puVar8;
              puVar9 = puVar13;
            } while ((long)local_e8 + 1U != local_88);
            uVar5 = (int)local_90 + 1;
            uVar11 = (ulong)uVar5;
            iVar7 = local_c8 + -1;
            if (uVar5 == 0x51) {
              aom_free(input_);
              aom_free(output_);
              aom_free(output2_);
              aom_free(tmpbuf);
              return;
            }
          } while( true );
        }
        testing::Message::Message((Message *)xqd);
        if (local_108 == (undefined8 *)0x0) {
          pSVar12 = "";
        }
        else {
          pSVar12 = (SEARCH_METHODS *)*local_108;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_f8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/selfguided_filter_test.cc"
                   ,0x15f,(char *)pSVar12);
        testing::internal::AssertHelper::operator=(&local_f8,(Message *)xqd);
        testing::internal::AssertHelper::~AssertHelper(&local_f8);
        if (xqd != (int  [2])0x0) {
          (**(code **)(*(long *)xqd + 8))();
        }
        if (local_108 == (undefined8 *)0x0) {
          return;
        }
        if ((undefined8 *)*local_108 != local_108 + 2) {
          operator_delete((undefined8 *)*local_108);
        }
      }
    }
  }
LAB_00489190:
  operator_delete(local_108);
  return;
}

Assistant:

TEST_P(AV1HighbdSelfguidedFilterTest, CorrectnessTest) { RunCorrectnessTest(); }